

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FullSegment.hpp
# Opt level: O3

void __thiscall
cppjieba::FullSegment::Cut
          (FullSegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res)

{
  pointer *ppWVar1;
  size_t sVar2;
  pair<unsigned_long,_const_cppjieba::DictUnit_*> *ppVar3;
  ulong uVar4;
  long lVar5;
  pointer pDVar6;
  pointer pDVar7;
  ulong uVar8;
  long lVar9;
  iterator __position;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  WordRange wr;
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> dags;
  LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> tRes;
  WordRange local_180;
  const_iterator local_170;
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> local_168;
  undefined1 local_148 [256];
  undefined1 *local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  memset(local_148,0,0x100);
  local_40 = 0;
  local_38 = 0x10;
  local_48 = local_148;
  if (this->dictTrie_ == (DictTrie *)0x0) {
    __assert_fail("dictTrie_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/FullSegment.hpp"
                  ,0x3e,
                  "void cppjieba::FullSegment::Cut(RuneStrArray::const_iterator, RuneStrArray::const_iterator, vector<WordRange> &) const"
                 );
  }
  local_168.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Trie::Find(this->dictTrie_->trie_,begin,end,&local_168,0x200);
  if (local_168.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_168.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar11 = 0;
    uVar8 = 0;
    uVar10 = 0;
    pDVar6 = local_168.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
             super__Vector_impl_data._M_start;
    pDVar7 = local_168.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      sVar2 = pDVar6[uVar8].nexts.size_;
      if (sVar2 != 0) {
        local_170 = begin + uVar8;
        bVar13 = sVar2 != 1;
        lVar9 = 8;
        uVar12 = 0;
        do {
          ppVar3 = pDVar6[uVar8].nexts.ptr_;
          uVar4 = *(ulong *)((long)ppVar3 + lVar9 + -8);
          if ((ulong)(((long)local_168.
                             super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pDVar6 >> 3) *
                     -0x7063e7063e7063e7) <= uVar4) {
            __assert_fail("nextoffset < dags.size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/FullSegment.hpp"
                          ,0x44,
                          "void cppjieba::FullSegment::Cut(RuneStrArray::const_iterator, RuneStrArray::const_iterator, vector<WordRange> &) const"
                         );
          }
          lVar5 = *(long *)((long)&ppVar3->first + lVar9);
          if (lVar5 == 0) {
            if (!bVar13 && uVar11 <= uVar8) {
              local_180.right = begin + uVar4;
              local_180.left = local_170;
              __position._M_current =
                   (res->
                   super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current !=
                  (res->
                  super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
                  _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0011a51a;
              std::vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>>::
              _M_realloc_insert<cppjieba::WordRange_const&>
                        ((vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>> *)res,
                         __position,&local_180);
            }
          }
          else {
            uVar10 = *(ulong *)(lVar5 + 0x48);
            if ((1 < uVar10) || (!bVar13 && uVar11 <= uVar8)) {
              local_180.right = begin + uVar4;
              local_180.left = local_170;
              __position._M_current =
                   (res->
                   super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (res->
                  super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>>::
                _M_realloc_insert<cppjieba::WordRange_const&>
                          ((vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>> *)res,
                           __position,&local_180);
              }
              else {
LAB_0011a51a:
                local_180.right = begin + uVar4;
                local_180.left = local_170;
                (__position._M_current)->left = local_170;
                (__position._M_current)->right = local_180.right;
                ppWVar1 = &(res->
                           super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppWVar1 = *ppWVar1 + 1;
              }
            }
          }
          if (uVar11 < uVar10 + uVar8) {
            uVar11 = uVar10 + uVar8;
          }
          uVar12 = uVar12 + 1;
          lVar9 = lVar9 + 0x10;
          bVar13 = true;
          pDVar6 = local_168.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pDVar7 = local_168.super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        } while (uVar12 < local_168.
                          super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar8].nexts.size_);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)(((long)pDVar7 - (long)pDVar6 >> 3) * -0x7063e7063e7063e7));
  }
  std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::~vector(&local_168);
  if (local_48 != local_148) {
    free(local_48);
  }
  return;
}

Assistant:

void Cut(RuneStrArray::const_iterator begin, 
        RuneStrArray::const_iterator end, 
        vector<WordRange>& res) const {
    // result of searching in trie tree
    LocalVector<pair<size_t, const DictUnit*> > tRes;

    // max index of res's words
    size_t maxIdx = 0;

    // always equals to (uItr - begin)
    size_t uIdx = 0;

    // tmp variables
    size_t wordLen = 0;
    assert(dictTrie_);
    vector<struct Dag> dags;
    dictTrie_->Find(begin, end, dags);
    for (size_t i = 0; i < dags.size(); i++) {
      for (size_t j = 0; j < dags[i].nexts.size(); j++) {
        size_t nextoffset = dags[i].nexts[j].first;
        assert(nextoffset < dags.size());
        const DictUnit* du = dags[i].nexts[j].second;
        if (du == NULL) {
          if (dags[i].nexts.size() == 1 && maxIdx <= uIdx) {
            WordRange wr(begin + i, begin + nextoffset);
            res.push_back(wr);
          }
        } else {
          wordLen = du->word.size();
          if (wordLen >= 2 || (dags[i].nexts.size() == 1 && maxIdx <= uIdx)) {
            WordRange wr(begin + i, begin + nextoffset);
            res.push_back(wr);
          }
        }
        maxIdx = uIdx + wordLen > maxIdx ? uIdx + wordLen : maxIdx;
      }
      uIdx++;
    }
  }